

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecp_curves.c
# Opt level: O3

int ecp_mod_p256(mbedtls_mpi *N)

{
  ulong *puVar1;
  mbedtls_mpi_uint *pmVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  ulong uVar7;
  byte bVar8;
  uint uVar9;
  uint uVar10;
  byte bVar11;
  uint uVar12;
  uint uVar13;
  ulong uVar14;
  uint uVar15;
  uint uVar16;
  uint uVar17;
  uint uVar18;
  uint uVar19;
  uint uVar20;
  uint uVar21;
  uint uVar22;
  char cVar23;
  uint uVar24;
  uint uVar25;
  uint uVar26;
  uint uVar27;
  mbedtls_mpi C;
  mbedtls_mpi_uint Cp [5];
  mbedtls_mpi local_70;
  mbedtls_mpi_uint local_58 [5];
  
  local_70.s = 1;
  local_70.n = 5;
  local_70.p = local_58;
  local_58[0] = 0;
  local_58[1] = 0;
  local_58[2] = 0;
  local_58[3] = 0;
  local_58[4] = 0;
  iVar4 = mbedtls_mpi_grow(N,8);
  if (iVar4 == 0) {
    pmVar2 = N->p;
    uVar7 = pmVar2[4];
    uVar3 = (uint)uVar7;
    uVar22 = (uint)*pmVar2;
    uVar17 = uVar3 + uVar22;
    uVar12 = (uint)(uVar7 >> 0x20);
    uVar18 = uVar17 + uVar12;
    uVar6 = (uint)(pmVar2[5] >> 0x20);
    uVar19 = uVar18 - uVar6;
    uVar9 = (uint)pmVar2[6];
    uVar20 = uVar19 - uVar9;
    uVar10 = (uint)(pmVar2[6] >> 0x20);
    uVar21 = uVar20 - uVar10;
    uVar13 = (uint)pmVar2[7];
    cVar23 = ((((CARRY4(uVar17,uVar12) + CARRY4(uVar3,uVar22)) - (uVar18 < uVar6)) -
              (uVar19 < uVar9)) - (uVar20 < uVar10)) - (uVar21 < uVar13);
    uVar17 = (uint)cVar23;
    uVar22 = (uint)(*pmVar2 >> 0x20);
    if (cVar23 < '\0') {
      cVar23 = -(uVar22 < -uVar17);
    }
    else {
      cVar23 = CARRY4(uVar17,uVar22);
    }
    uVar20 = uVar17 + uVar22 + uVar12;
    uVar18 = (uint)pmVar2[5];
    uVar24 = uVar20 + uVar18;
    uVar25 = uVar24 - uVar9;
    uVar26 = uVar25 - uVar10;
    uVar27 = uVar26 - uVar13;
    uVar19 = (uint)(pmVar2[7] >> 0x20);
    cVar23 = ((((CARRY4(uVar17 + uVar22,uVar12) + cVar23 + CARRY4(uVar20,uVar18)) - (uVar24 < uVar9)
               ) - (uVar25 < uVar10)) - (uVar26 < uVar13)) - (uVar27 < uVar19);
    *pmVar2 = CONCAT44(uVar27 - uVar19,uVar21 - uVar13);
    uVar22 = (uint)cVar23;
    uVar17 = (uint)pmVar2[1];
    if (cVar23 < '\0') {
      cVar23 = -(uVar17 < -uVar22);
    }
    else {
      cVar23 = CARRY4(uVar22,uVar17);
    }
    uVar20 = uVar22 + uVar17 + uVar18;
    uVar21 = uVar20 + uVar6;
    uVar24 = uVar21 - uVar10;
    uVar25 = uVar24 - uVar13;
    cVar23 = (((CARRY4(uVar22 + uVar17,uVar18) + cVar23 + CARRY4(uVar20,uVar6)) - (uVar21 < uVar10))
             - (uVar24 < uVar13)) - (uVar25 < uVar19);
    uVar22 = (uint)cVar23;
    uVar17 = (uint)(pmVar2[1] >> 0x20);
    if (cVar23 < '\0') {
      cVar23 = -(uVar17 < -uVar22);
    }
    else {
      cVar23 = CARRY4(uVar22,uVar17);
    }
    uVar20 = uVar22 + uVar17 + uVar6;
    uVar21 = uVar20 + uVar6;
    uVar24 = uVar21 + uVar9;
    uVar26 = uVar24 + uVar9;
    uVar27 = uVar26 + uVar10;
    uVar15 = uVar27 - uVar19;
    uVar16 = uVar15 - uVar3;
    cVar23 = (((CARRY4(uVar24,uVar9) +
                CARRY4(uVar20,uVar6) + cVar23 + CARRY4(uVar22 + uVar17,uVar6) + CARRY4(uVar21,uVar9)
               + CARRY4(uVar26,uVar10)) - (uVar27 < uVar19)) - (uVar15 < uVar3)) - (uVar16 < uVar12)
    ;
    pmVar2[1] = CONCAT44(uVar16 - uVar12,uVar25 - uVar19);
    uVar22 = (uint)cVar23;
    uVar17 = (uint)pmVar2[2];
    if (cVar23 < '\0') {
      cVar23 = -(uVar17 < -uVar22);
    }
    else {
      cVar23 = CARRY4(uVar22,uVar17);
    }
    uVar20 = uVar22 + uVar17 + uVar9;
    uVar21 = uVar20 + uVar9;
    uVar24 = uVar21 + uVar10;
    uVar25 = uVar24 + uVar10;
    uVar26 = uVar25 + uVar13;
    uVar27 = uVar26 - uVar12;
    cVar23 = ((CARRY4(uVar24,uVar10) +
               CARRY4(uVar20,uVar9) + cVar23 + CARRY4(uVar22 + uVar17,uVar9) + CARRY4(uVar21,uVar10)
              + CARRY4(uVar25,uVar13)) - (uVar26 < uVar12)) - (uVar27 < uVar18);
    uVar22 = (uint)cVar23;
    uVar17 = (uint)(pmVar2[2] >> 0x20);
    if (cVar23 < '\0') {
      cVar23 = -(uVar17 < -uVar22);
    }
    else {
      cVar23 = CARRY4(uVar22,uVar17);
    }
    uVar20 = uVar22 + uVar17 + uVar10;
    uVar21 = uVar20 + uVar10;
    uVar24 = uVar21 + uVar13;
    uVar25 = uVar24 + uVar13;
    uVar26 = uVar25 + uVar19;
    uVar15 = uVar26 - uVar18;
    cVar23 = ((CARRY4(uVar24,uVar13) +
               CARRY4(uVar20,uVar10) + cVar23 + CARRY4(uVar22 + uVar17,uVar10) +
               CARRY4(uVar21,uVar13) + CARRY4(uVar25,uVar19)) - (uVar26 < uVar18)) -
             (uVar15 < uVar6);
    pmVar2[2] = CONCAT44(uVar15 - uVar6,uVar27 - uVar18);
    uVar22 = (uint)cVar23;
    uVar17 = (uint)pmVar2[3];
    if (cVar23 < '\0') {
      cVar23 = -(uVar17 < -uVar22);
    }
    else {
      cVar23 = CARRY4(uVar22,uVar17);
    }
    uVar20 = uVar22 + uVar17 + uVar13;
    uVar21 = uVar20 + uVar13;
    uVar24 = uVar21 + uVar19;
    uVar25 = uVar24 + uVar19;
    uVar26 = uVar25 + uVar13;
    uVar27 = uVar26 + uVar10;
    uVar15 = uVar27 - uVar3;
    cVar23 = ((CARRY4(uVar25,uVar13) +
               CARRY4(uVar21,uVar19) +
               CARRY4(uVar22 + uVar17,uVar13) + cVar23 + CARRY4(uVar20,uVar13) +
               CARRY4(uVar24,uVar19) + CARRY4(uVar26,uVar10)) - (uVar27 < uVar3)) -
             (uVar15 < uVar12);
    uVar22 = (uint)cVar23;
    uVar13 = (uint)(pmVar2[3] >> 0x20);
    if (cVar23 < '\0') {
      cVar23 = -(uVar13 < -uVar22);
    }
    else {
      cVar23 = CARRY4(uVar22,uVar13);
    }
    uVar17 = uVar22 + uVar13 + uVar19;
    uVar20 = uVar17 + uVar19;
    uVar21 = uVar20 + uVar19;
    uVar24 = uVar21 + uVar3;
    uVar25 = uVar24 - uVar18;
    uVar26 = uVar25 - uVar6;
    uVar27 = uVar26 - uVar9;
    bVar11 = ((((CARRY4(uVar20,uVar19) +
                 CARRY4(uVar22 + uVar13,uVar19) + cVar23 + CARRY4(uVar17,uVar19) +
                CARRY4(uVar21,uVar3)) - (uVar24 < uVar18)) - (uVar25 < uVar6)) - (uVar26 < uVar9)) -
             (uVar27 < uVar10);
    bVar8 = 0;
    if ('\0' < (char)bVar11) {
      bVar8 = bVar11;
    }
    pmVar2[3] = CONCAT44(uVar27 - uVar10,uVar15 - uVar12);
    pmVar2[4] = (ulong)bVar8 | uVar7 & 0xffffffff00000000;
    if (9 < N->n * 2) {
      uVar7 = 8;
      do {
        uVar14 = 0xffffffff00000000;
        if ((uVar7 & 1) == 0) {
          uVar14 = 0xffffffff;
        }
        puVar1 = (ulong *)((long)pmVar2 + (uVar7 + 1 & 0xfffffffffffffffe) * 4);
        *puVar1 = *puVar1 & uVar14;
        uVar14 = uVar7 + 2;
        uVar7 = uVar7 + 1;
      } while (uVar14 < N->n * 2);
    }
    if ((char)bVar11 < '\0') {
      local_58[4] = -(long)(char)bVar11;
      iVar5 = mbedtls_mpi_sub_abs(N,&local_70,N);
      if (iVar5 == 0) {
        N->s = -1;
      }
    }
  }
  return iVar4;
}

Assistant:

static int ecp_mod_p256( mbedtls_mpi *N )
{
    INIT( 256 );

    ADD(  8 ); ADD(  9 );
    SUB( 11 ); SUB( 12 ); SUB( 13 ); SUB( 14 );             NEXT; // A0

    ADD(  9 ); ADD( 10 );
    SUB( 12 ); SUB( 13 ); SUB( 14 ); SUB( 15 );             NEXT; // A1

    ADD( 10 ); ADD( 11 );
    SUB( 13 ); SUB( 14 ); SUB( 15 );                        NEXT; // A2

    ADD( 11 ); ADD( 11 ); ADD( 12 ); ADD( 12 ); ADD( 13 );
    SUB( 15 ); SUB(  8 ); SUB(  9 );                        NEXT; // A3

    ADD( 12 ); ADD( 12 ); ADD( 13 ); ADD( 13 ); ADD( 14 );
    SUB(  9 ); SUB( 10 );                                   NEXT; // A4

    ADD( 13 ); ADD( 13 ); ADD( 14 ); ADD( 14 ); ADD( 15 );
    SUB( 10 ); SUB( 11 );                                   NEXT; // A5

    ADD( 14 ); ADD( 14 ); ADD( 15 ); ADD( 15 ); ADD( 14 ); ADD( 13 );
    SUB(  8 ); SUB(  9 );                                   NEXT; // A6

    ADD( 15 ); ADD( 15 ); ADD( 15 ); ADD( 8 );
    SUB( 10 ); SUB( 11 ); SUB( 12 ); SUB( 13 );             LAST; // A7

cleanup:
    return( ret );
}